

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::SignCaseInstance::compare
          (SignCaseInstance *this,void **inputs,void **outputs)

{
  float fVar1;
  DataType dataType;
  int iVar2;
  pointer pSVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  ostringstream *poVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  deUint32 u32;
  HexFloat local_3c;
  undefined1 local_38 [16];
  
  pSVar3 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar3->varType).m_data.basic.type;
  iVar2 = *(int *)((long)&(pSVar3->varType).m_data + 4);
  uVar5 = glu::getDataTypeScalarSize(dataType);
  if (dataType - TYPE_FLOAT < 4) {
    uVar8 = 0xffff;
    if (iVar2 != 0) {
      uVar8 = 0;
    }
    if (0 < (int)uVar5) {
      uVar9 = 0;
      do {
        fVar1 = *(float *)((long)*inputs + uVar9 * 4);
        uVar11 = -(uint)(fVar1 < 0.0);
        uVar4 = uVar11 & 0xbf800000 | ~uVar11 & -(uint)(0.0 < fVar1) & 0x3f800000;
        local_38 = ZEXT416(uVar4);
        uVar11 = *(uint *)((long)*outputs + uVar9 * 4);
        uVar10 = uVar4 - uVar11;
        if (uVar4 < uVar11) {
          uVar10 = -(uVar4 - uVar11);
        }
        if (uVar8 < uVar10) {
          poVar7 = &(this->super_CommonFunctionTestInstance).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"Expected [",10);
          poVar6 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] = ",4);
          local_3c.value = (float)local_38._0_4_;
          poVar6 = anon_unknown_0::operator<<(poVar6,&local_3c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," with ULP threshold ",0x14);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", got ULP diff ",0xf);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          return false;
        }
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
    }
  }
  else if (0 < (int)uVar5) {
    uVar9 = 0;
    do {
      iVar2 = *(int *)((long)*inputs + uVar9 * 4);
      uVar8 = (uint)(iVar2 != 0);
      if (iVar2 < 0) {
        uVar8 = 0xffffffff;
      }
      if (*(uint *)((long)*outputs + uVar9 * 4) != uVar8) {
        poVar7 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"Expected [",10);
        poVar6 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] = ",4);
        std::ostream::operator<<(poVar6,uVar8);
        return false;
      }
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
		{
			// Both highp and mediump should be able to represent -1, 0, and +1 exactly
			const deUint32 maxUlpDiff = precision == glu::PRECISION_LOWP ? getMaxUlpDiffFromBits(getMinMantissaBits(precision)) : 0;

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref0		= in0 < 0.0f ? -1.0f :
											  in0 > 0.0f ? +1.0f : 0.0f;
				const deUint32	ulpDiff0	= getUlpDiff(out0, ref0);

				if (ulpDiff0 > maxUlpDiff)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref0) << " with ULP threshold " << maxUlpDiff << ", got ULP diff " << ulpDiff0;
					return false;
				}
			}
		}
		else
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const int	in0		= ((const int*)inputs[0])[compNdx];
				const int	out0	= ((const int*)outputs[0])[compNdx];
				const int	ref0	= in0 < 0 ? -1 :
									  in0 > 0 ? +1 : 0;

				if (out0 != ref0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << ref0;
					return false;
				}
			}
		}

		return true;
	}